

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_newmetatable(lua_State *L,char *tname)

{
  int iVar1;
  
  lua_getfield(L,-10000,tname);
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    lua_createtable(L,0,0);
    lua_pushvalue(L,-1);
    lua_setfield(L,-10000,tname);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

LUALIB_API int luaL_newmetatable (lua_State *L, const char *tname) {
  lua_getfield(L, LUA_REGISTRYINDEX, tname);  /* get registry.name */
  if (!lua_isnil(L, -1))  /* name already in use? */
    return 0;  /* leave previous value on top, but return 0 */
  lua_pop(L, 1);
  lua_newtable(L);  /* create metatable */
  lua_pushvalue(L, -1);
  lua_setfield(L, LUA_REGISTRYINDEX, tname);  /* registry.name = metatable */
  return 1;
}